

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O3

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadAnimation(OgreBinarySerializer *this,Animation *anim)

{
  StreamReader<false,_false> *pSVar1;
  undefined1 *puVar2;
  unsigned_short uVar3;
  uint uVar4;
  MemoryStreamReader *this_00;
  bool bVar5;
  bool bVar6;
  float fVar7;
  VertexAnimationTrack track;
  VertexAnimationTrack local_a0;
  
  pSVar1 = this->m_reader;
  if (*(int *)&pSVar1->end != *(int *)&pSVar1->current) {
    uVar3 = StreamReader<false,_false>::Get<unsigned_short>(pSVar1);
    uVar4 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
    this->m_currentLen = uVar4;
    if (uVar3 == 0xd105) {
      ReadLine_abi_cxx11_((string *)&local_a0,this);
      std::__cxx11::string::operator=((string *)&anim->baseName,(string *)&local_a0);
      puVar2 = (undefined1 *)CONCAT26(local_a0._6_2_,CONCAT24(local_a0.target,local_a0.type));
      if ((size_type *)puVar2 != &local_a0.boneName._M_string_length) {
        operator_delete(puVar2);
      }
      fVar7 = StreamReader<false,_false>::Get<float>(this->m_reader);
      anim->baseTime = fVar7;
      uVar3 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
      uVar4 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
      this->m_currentLen = uVar4;
    }
    this_00 = this->m_reader;
    bVar5 = *(int *)&this_00->end == *(int *)&this_00->current;
    if ((uVar3 == 0xd110) && (*(int *)&this_00->end != *(int *)&this_00->current)) {
      do {
        VertexAnimationTrack::VertexAnimationTrack(&local_a0);
        uVar3 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
        local_a0.type = (Type)uVar3;
        local_a0.target = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
        ReadAnimationKeyFrames(this,anim,&local_a0);
        std::
        vector<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
        ::push_back(&anim->tracks,&local_a0);
        pSVar1 = this->m_reader;
        if (*(int *)&pSVar1->end == *(int *)&pSVar1->current) {
          bVar6 = false;
        }
        else {
          uVar3 = StreamReader<false,_false>::Get<unsigned_short>(pSVar1);
          uVar4 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
          this->m_currentLen = uVar4;
          bVar6 = uVar3 != 0xd110;
        }
        if (local_a0.transformKeyFrames.
            super__Vector_base<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a0.transformKeyFrames.
                          super__Vector_base<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        std::vector<Assimp::Ogre::MorphKeyFrame,_std::allocator<Assimp::Ogre::MorphKeyFrame>_>::
        ~vector(&local_a0.morphKeyFrames);
        std::vector<Assimp::Ogre::PoseKeyFrame,_std::allocator<Assimp::Ogre::PoseKeyFrame>_>::
        ~vector(&local_a0.poseKeyFrames);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0.boneName._M_dataplus._M_p != &local_a0.boneName.field_2) {
          operator_delete(local_a0.boneName._M_dataplus._M_p);
        }
        this_00 = this->m_reader;
        bVar5 = *(int *)&this_00->end == *(int *)&this_00->current;
      } while (!(bool)(bVar6 | bVar5));
    }
    if (!bVar5) {
      StreamReader<false,_false>::IncPtr(this_00,-6);
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadAnimation(Animation *anim)
{
    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        if (id == M_ANIMATION_BASEINFO)
        {
            anim->baseName = ReadLine();
            anim->baseTime = Read<float>();

            // Advance to first track
            id = ReadHeader();
        }

        while (!AtEnd() && id == M_ANIMATION_TRACK)
        {
            VertexAnimationTrack track;
            track.type = static_cast<VertexAnimationTrack::Type>(Read<uint16_t>());
            track.target = Read<uint16_t>();

            ReadAnimationKeyFrames(anim, &track);

            anim->tracks.push_back(track);

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}